

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeadArgumentElimination.cpp
# Opt level: O1

bool __thiscall
wasm::DAE::refineReturnTypes
          (DAE *this,Function *func,vector<wasm::Call_*,_std::allocator<wasm::Call_*>_> *calls,
          Module *module)

{
  pointer ppCVar1;
  uintptr_t in_RAX;
  Type TVar2;
  pointer ppCVar3;
  HeapType *this_00;
  vector<wasm::Call_*,_std::allocator<wasm::Call_*>_> *__range3;
  bool bVar4;
  Signature SVar5;
  Signature sig;
  HeapType local_38;
  
  local_38.id = in_RAX;
  TVar2.id = (uintptr_t)LUB::getResultsLUB(func,module);
  if (TVar2.id == 1) {
    bVar4 = false;
  }
  else {
    this_00 = &func->type;
    SVar5 = HeapType::getSignature(this_00);
    bVar4 = TVar2.id != SVar5.results.id.id;
    if (bVar4) {
      SVar5 = HeapType::getSignature(this_00);
      sig.results.id = TVar2.id;
      sig.params.id = SVar5.params.id.id;
      HeapType::HeapType(&local_38,sig);
      this_00->id = local_38.id;
      ppCVar1 = (calls->super__Vector_base<wasm::Call_*,_std::allocator<wasm::Call_*>_>)._M_impl.
                super__Vector_impl_data._M_finish;
      for (ppCVar3 = (calls->super__Vector_base<wasm::Call_*,_std::allocator<wasm::Call_*>_>).
                     _M_impl.super__Vector_impl_data._M_start; ppCVar3 != ppCVar1;
          ppCVar3 = ppCVar3 + 1) {
        if (((*ppCVar3)->super_SpecificExpression<(wasm::Expression::Id)6>).super_Expression.type.id
            != 1) {
          ((*ppCVar3)->super_SpecificExpression<(wasm::Expression::Id)6>).super_Expression.type.id =
               TVar2.id;
        }
      }
    }
  }
  return bVar4;
}

Assistant:

bool refineReturnTypes(Function* func,
                         const std::vector<Call*>& calls,
                         Module* module) {
    auto lub = LUB::getResultsLUB(func, *module);
    if (!lub.noted()) {
      return false;
    }
    auto newType = lub.getLUB();
    if (newType != func->getResults()) {
      func->setResults(newType);
      for (auto* call : calls) {
        if (call->type != Type::unreachable) {
          call->type = newType;
        }
      }
      return true;
    }
    return false;
  }